

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_int16(flatcc_json_parser_t *ctx,char *buf,char *end,int16_t *v)

{
  char *buf_00;
  int value_sign;
  uint64_t value;
  int local_2c;
  uint64_t local_28;
  
  local_28 = 0;
  local_2c = 0;
  *v = 0;
  buf_00 = buf;
  if ((buf != end) &&
     (buf_00 = flatcc_json_parser_integer(ctx,buf,end,&local_2c,&local_28), buf_00 != buf)) {
    buf_00 = flatcc_json_parser_coerce_int16(ctx,buf_00,end,local_2c,local_28,v);
  }
  return buf_00;
}

Assistant:

static inline const char *flatcc_json_parser_bool(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t *v)
{
    const char *k;
    uint8_t tmp;

    k = buf;
    if (end - buf >= 4 && memcmp(buf, "true", 4) == 0) {
        *v = 1;
        return k + 4;
    } else if (end - buf >= 5 && memcmp(buf, "false", 5) == 0) {
        *v = 0;
        return k + 5;
    }
    buf = flatcc_json_parser_uint8(ctx, buf, end, &tmp);
    *v = !!tmp;
    return buf;
}